

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O2

void __thiscall xray_re::xr_scene_lights::xr_scene_lights(xr_scene_lights *this,xr_scene *scene)

{
  xr_token_vec *this_00;
  xr_token local_40;
  
  xr_scene_objects::xr_scene_objects
            (&this->super_xr_scene_objects,scene,"light.part",SCENE_CHUNK_LIGHTS);
  (this->super_xr_scene_objects).super_xr_scene_part._vptr_xr_scene_part =
       (_func_int **)&PTR__xr_scene_lights_00239c18;
  this->m_flags = 0;
  this_00 = &this->m_controls;
  (this->m_controls).super__Vector_base<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_controls).super__Vector_base<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_controls).super__Vector_base<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sun).field_0 = (anon_union_8_3_f28016de_for__vector2<float>_1)0x40a31565bedf66f3;
  xr_token::xr_token(&local_40,"$static",0);
  std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>::
  emplace_back<xray_re::xr_token>(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  xr_token::xr_token(&local_40,"$hemi",1);
  std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>::
  emplace_back<xray_re::xr_token>(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  xr_token::xr_token(&local_40,"$sun",2);
  std::vector<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>::
  emplace_back<xray_re::xr_token>(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

xr_scene_lights::xr_scene_lights(xr_scene& scene):
	xr_scene_objects(scene, "light.part", SCENE_CHUNK_LIGHTS),
	m_flags(0)
{
	m_sun.set(deg2rad(-25.f), deg2rad(292.f));
	m_controls.push_back(xr_token("$static", 0));
	m_controls.push_back(xr_token("$hemi", 1));
	m_controls.push_back(xr_token("$sun", 2));
}